

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

void evthread_enable_lock_debugging(void)

{
  undefined1 local_30 [8];
  evthread_lock_callbacks cbs;
  
  memcpy(local_30,&DAT_003f1918,0x28);
  if (evthread_lock_debugging_enabled_ == 0) {
    memcpy(&original_lock_fns_,&evthread_lock_fns_,0x28);
    memcpy(&evthread_lock_fns_,local_30,0x28);
    memcpy(&original_cond_fns_,&evthread_cond_fns_,0x28);
    evthread_cond_fns_.wait_condition = debug_cond_wait;
    evthread_lock_debugging_enabled_ = 1;
    event_global_setup_locks_(0);
  }
  return;
}

Assistant:

void
evthread_enable_lock_debugging(void)
{
	struct evthread_lock_callbacks cbs = {
		EVTHREAD_LOCK_API_VERSION,
		EVTHREAD_LOCKTYPE_RECURSIVE,
		debug_lock_alloc,
		debug_lock_free,
		debug_lock_lock,
		debug_lock_unlock
	};
	if (evthread_lock_debugging_enabled_)
		return;
	memcpy(&original_lock_fns_, &evthread_lock_fns_,
	    sizeof(struct evthread_lock_callbacks));
	memcpy(&evthread_lock_fns_, &cbs,
	    sizeof(struct evthread_lock_callbacks));

	memcpy(&original_cond_fns_, &evthread_cond_fns_,
	    sizeof(struct evthread_condition_callbacks));
	evthread_cond_fns_.wait_condition = debug_cond_wait;
	evthread_lock_debugging_enabled_ = 1;

	/* XXX return value should get checked. */
	event_global_setup_locks_(0);
}